

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O0

float anon_unknown.dwarf_bd0dc::drand(void)

{
  int iVar1;
  result_type_conflict rVar2;
  float r;
  float in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if ((anonymous_namespace)::drand()::generator == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::drand()::generator);
    if (iVar1 != 0) {
      std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
      linear_congruential_engine
                ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x1b26da);
      __cxa_guard_release(&(anonymous_namespace)::drand()::generator);
    }
  }
  if ((anonymous_namespace)::drand()::distribution == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::drand()::distribution);
    if (iVar1 != 0) {
      std::uniform_real_distribution<float>::uniform_real_distribution
                ((uniform_real_distribution<float> *)
                 CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
      __cxa_guard_release(&(anonymous_namespace)::drand()::distribution);
    }
  }
  rVar2 = std::uniform_real_distribution<float>::operator()
                    ((uniform_real_distribution<float> *)
                     CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return rVar2;
}

Assistant:

float
drand ()
{
    static std::default_random_engine            generator;
    static std::uniform_real_distribution<float> distribution (0.0f, 1.0f);
    float                                        r = distribution (generator);
    return r;
}